

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readasy.c
# Opt level: O0

DUMB_IT_SIGDATA * it_asy_load_sigdata(DUMBFILE *f)

{
  char cVar1;
  int32 iVar2;
  int iVar3;
  DUMB_IT_SIGDATA *__ptr;
  uchar *puVar4;
  IT_SAMPLE *pIVar5;
  IT_PATTERN *pIVar6;
  DUMBFILE *f_00;
  DUMBFILE *in_RDI;
  int sep;
  uchar *buffer;
  char signature [32];
  int i;
  DUMB_IT_SIGDATA *sigdata;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  DUMBFILE *in_stack_ffffffffffffffb0;
  DUMB_IT_SIGDATA *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int32 in_stack_ffffffffffffffc4;
  IT_PATTERN *in_stack_ffffffffffffffc8;
  int local_1c;
  
  iVar2 = dumbfile_getnc((char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                         (DUMBFILE *)in_stack_ffffffffffffffb8);
  if (((iVar2 != 0x20) ||
      (iVar3 = memcmp(&stack0xffffffffffffffb8,"ASYLUM Music Format",0x13), iVar3 != 0)) ||
     (iVar3 = memcmp(&stack0xffffffffffffffcb," V1.0",5), iVar3 != 0)) {
    return (DUMB_IT_SIGDATA *)0x0;
  }
  __ptr = (DUMB_IT_SIGDATA *)malloc(0x138);
  if (__ptr == (DUMB_IT_SIGDATA *)0x0) {
    return (DUMB_IT_SIGDATA *)0x0;
  }
  iVar3 = dumbfile_getc((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  __ptr->speed = iVar3;
  iVar3 = dumbfile_getc((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  __ptr->tempo = iVar3;
  iVar3 = dumbfile_getc((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  __ptr->n_samples = iVar3;
  iVar3 = dumbfile_getc((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  __ptr->n_patterns = iVar3;
  iVar3 = dumbfile_getc((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  __ptr->n_orders = iVar3;
  iVar3 = dumbfile_getc((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  __ptr->restart_position = (uchar)iVar3;
  iVar3 = dumbfile_error(in_RDI);
  if (((iVar3 != 0) || (__ptr->n_samples == 0)) ||
     ((0x40 < __ptr->n_samples || ((__ptr->n_patterns == 0 || (__ptr->n_orders == 0)))))) {
    free(__ptr);
    return (DUMB_IT_SIGDATA *)0x0;
  }
  if (__ptr->n_orders < (int)(uint)__ptr->restart_position) {
    __ptr->restart_position = '\0';
  }
  puVar4 = (uchar *)malloc((long)__ptr->n_orders);
  __ptr->order = puVar4;
  if (__ptr->order == (uchar *)0x0) {
    free(__ptr);
    return (DUMB_IT_SIGDATA *)0x0;
  }
  iVar2 = dumbfile_getnc((char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                         (DUMBFILE *)in_stack_ffffffffffffffb8);
  if ((iVar2 != __ptr->n_orders) ||
     (iVar3 = dumbfile_skip((DUMBFILE *)in_stack_ffffffffffffffb8,(long)in_stack_ffffffffffffffb0),
     iVar3 != 0)) {
    free(__ptr->order);
    free(__ptr);
    return (DUMB_IT_SIGDATA *)0x0;
  }
  pIVar5 = (IT_SAMPLE *)malloc((long)__ptr->n_samples * 0x68);
  __ptr->sample = pIVar5;
  if (__ptr->sample == (IT_SAMPLE *)0x0) {
    free(__ptr->order);
    free(__ptr);
    return (DUMB_IT_SIGDATA *)0x0;
  }
  __ptr->song_message = (uchar *)0x0;
  __ptr->instrument = (IT_INSTRUMENT *)0x0;
  __ptr->pattern = (IT_PATTERN *)0x0;
  __ptr->midi = (IT_MIDI *)0x0;
  __ptr->checkpoint = (IT_CHECKPOINT *)0x0;
  __ptr->n_instruments = 0;
  for (local_1c = 0; local_1c < __ptr->n_samples; local_1c = local_1c + 1) {
    __ptr->sample[local_1c].data = (void *)0x0;
  }
  for (local_1c = 0; local_1c < __ptr->n_samples; local_1c = local_1c + 1) {
    iVar3 = it_asy_read_sample_header
                      ((IT_SAMPLE *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    if (iVar3 != 0) {
      _dumb_it_unload_sigdata
                ((sigdata_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      return (DUMB_IT_SIGDATA *)0x0;
    }
  }
  iVar3 = dumbfile_skip((DUMBFILE *)in_stack_ffffffffffffffb8,(long)in_stack_ffffffffffffffb0);
  if (iVar3 != 0) {
    _dumb_it_unload_sigdata
              ((sigdata_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    return (DUMB_IT_SIGDATA *)0x0;
  }
  pIVar6 = (IT_PATTERN *)malloc((long)__ptr->n_patterns << 4);
  __ptr->pattern = pIVar6;
  if (__ptr->pattern == (IT_PATTERN *)0x0) {
    _dumb_it_unload_sigdata
              ((sigdata_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    return (DUMB_IT_SIGDATA *)0x0;
  }
  for (local_1c = 0; local_1c < __ptr->n_patterns; local_1c = local_1c + 1) {
    __ptr->pattern[local_1c].entry = (IT_ENTRY *)0x0;
  }
  f_00 = (DUMBFILE *)malloc(0x800);
  if (f_00 == (DUMBFILE *)0x0) {
    _dumb_it_unload_sigdata
              ((sigdata_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    return (DUMB_IT_SIGDATA *)0x0;
  }
  for (local_1c = 0; local_1c < __ptr->n_patterns; local_1c = local_1c + 1) {
    iVar3 = it_asy_read_pattern(in_stack_ffffffffffffffc8,
                                (DUMBFILE *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                in_stack_ffffffffffffffb8->name);
    if (iVar3 != 0) {
      free(f_00);
      _dumb_it_unload_sigdata
                ((sigdata_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      return (DUMB_IT_SIGDATA *)0x0;
    }
  }
  free(f_00);
  local_1c = 0;
  while( true ) {
    if (__ptr->n_samples <= local_1c) {
      __ptr->flags = 0xf1;
      __ptr->global_volume = 0x80;
      __ptr->mixing_volume = 0x30;
      __ptr->pan_separation = 0x80;
      __ptr->n_pchannels = 8;
      __ptr->name[0] = '\0';
      memset(__ptr->channel_volume,0x40,0x40);
      for (local_1c = 0; local_1c < 0x40; local_1c = local_1c + 4) {
        cVar1 = (char)((dumb_it_default_panning_separation << 5) / 100);
        __ptr->channel_pan[local_1c] = ' ' - cVar1;
        __ptr->channel_pan[local_1c + 1] = cVar1 + ' ';
        __ptr->channel_pan[local_1c + 2] = cVar1 + ' ';
        __ptr->channel_pan[local_1c + 3] = ' ' - cVar1;
      }
      _dumb_it_fix_invalid_orders(in_stack_ffffffffffffffb8);
      return __ptr;
    }
    iVar3 = it_asy_read_sample_data((IT_SAMPLE *)in_stack_ffffffffffffffb8,f_00);
    if (iVar3 != 0) break;
    local_1c = local_1c + 1;
  }
  _dumb_it_unload_sigdata
            ((sigdata_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  return (DUMB_IT_SIGDATA *)0x0;
}

Assistant:

static DUMB_IT_SIGDATA *it_asy_load_sigdata(DUMBFILE *f)
{
	DUMB_IT_SIGDATA *sigdata;
	int i;

	static const char sig_part[] = "ASYLUM Music Format";
	static const char sig_rest[] = " V1.0"; /* whee, string space optimization with format type below */

	char signature [32];

	if ( dumbfile_getnc( signature, 32, f ) != 32 ||
		memcmp( signature, sig_part, 19 ) ||
		memcmp( signature + 19, sig_rest, 5 ) ) {
		return NULL;
	}

	sigdata = malloc(sizeof(*sigdata));
	if (!sigdata) {
		return NULL;
	}

	sigdata->speed = dumbfile_getc( f ); /* XXX seems to fit the files I have */
	sigdata->tempo = dumbfile_getc( f ); /* ditto */
	sigdata->n_samples = dumbfile_getc( f ); /* ditto */
	sigdata->n_patterns = dumbfile_getc( f );
	sigdata->n_orders = dumbfile_getc( f );
	sigdata->restart_position = dumbfile_getc( f );

	if ( dumbfile_error( f ) || !sigdata->n_samples || sigdata->n_samples > 64 || !sigdata->n_patterns ||
		!sigdata->n_orders ) {
		free( sigdata );
		return NULL;
	}

	if ( sigdata->restart_position > sigdata->n_orders ) /* XXX */
		sigdata->restart_position = 0;

	sigdata->order = malloc( sigdata->n_orders );
	if ( !sigdata->order ) {
		free( sigdata );
		return NULL;
	}

    if ( dumbfile_getnc( (char *) sigdata->order, sigdata->n_orders, f ) != sigdata->n_orders ||
		dumbfile_skip( f, 256 - sigdata->n_orders ) ) {
		free( sigdata->order );
		free( sigdata );
		return NULL;
	}

	sigdata->sample = malloc( sigdata->n_samples * sizeof( *sigdata->sample ) );
	if ( !sigdata->sample ) {
		free( sigdata->order );
		free( sigdata );
		return NULL;
	}

	sigdata->song_message = NULL;
	sigdata->instrument = NULL;
	sigdata->pattern = NULL;
	sigdata->midi = NULL;
	sigdata->checkpoint = NULL;

	sigdata->n_instruments = 0;

	for ( i = 0; i < sigdata->n_samples; ++i )
		sigdata->sample[i].data = NULL;

	for ( i = 0; i < sigdata->n_samples; ++i ) {
		if ( it_asy_read_sample_header( &sigdata->sample[i], f ) ) {
			_dumb_it_unload_sigdata( sigdata );
			return NULL;
		}
	}

	if ( dumbfile_skip( f, 37 * ( 64 - sigdata->n_samples ) ) ) {
		_dumb_it_unload_sigdata( sigdata );
		return NULL;
	}

	sigdata->pattern = malloc( sigdata->n_patterns * sizeof( *sigdata->pattern ) );
	if ( !sigdata->pattern ) {
		_dumb_it_unload_sigdata( sigdata );
		return NULL;
	}
	for (i = 0; i < sigdata->n_patterns; ++i)
		sigdata->pattern[i].entry = NULL;

	/* Read in the patterns */
	{
		unsigned char *buffer = malloc( 64 * 8 * 4 ); /* 64 rows * 8 channels * 4 bytes */
		if ( !buffer ) {
			_dumb_it_unload_sigdata( sigdata );
			return NULL;
		}
		for ( i = 0; i < sigdata->n_patterns; ++i ) {
			if ( it_asy_read_pattern( &sigdata->pattern[i], f, buffer ) != 0 ) {
				free( buffer );
				_dumb_it_unload_sigdata( sigdata );
				return NULL;
			}
		}
		free( buffer );
	}

	/* And finally, the sample data */
	for ( i = 0; i < sigdata->n_samples; ++i ) {
		if ( it_asy_read_sample_data( &sigdata->sample[i], f ) ) {
			_dumb_it_unload_sigdata( sigdata );
			return NULL;
		}
	}

	/* Now let's initialise the remaining variables, and we're done! */
	sigdata->flags = IT_WAS_AN_XM | IT_WAS_A_MOD | IT_OLD_EFFECTS | IT_COMPATIBLE_GXX | IT_STEREO;

	sigdata->global_volume = 128;
	sigdata->mixing_volume = 48;
	sigdata->pan_separation = 128;

	sigdata->n_pchannels = 8;

	sigdata->name[0] = 0;

	memset(sigdata->channel_volume, 64, DUMB_IT_N_CHANNELS);

	for (i = 0; i < DUMB_IT_N_CHANNELS; i += 4) {
		int sep = 32 * dumb_it_default_panning_separation / 100;
		sigdata->channel_pan[i+0] = 32 - sep;
		sigdata->channel_pan[i+1] = 32 + sep;
		sigdata->channel_pan[i+2] = 32 + sep;
		sigdata->channel_pan[i+3] = 32 - sep;
	}

	_dumb_it_fix_invalid_orders(sigdata);

	return sigdata;
}